

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O0

int bgzf_mt(BGZF *fp,int n_threads,int n_sub_blks)

{
  void *pvVar1;
  undefined1 local_68 [8];
  pthread_attr_t attr;
  mtaux_t *mt;
  int local_20;
  int i;
  int n_sub_blks_local;
  int n_threads_local;
  BGZF *fp_local;
  
  if ((((*(int *)fp << 0xe) >> 0x1e == 0) || (fp->mt != (bgzf_mtaux_t *)0x0)) || (n_threads < 2)) {
    fp_local._4_4_ = -1;
  }
  else {
    local_20 = n_sub_blks;
    i = n_threads;
    _n_sub_blks_local = fp;
    attr._48_8_ = calloc(1,0x90);
    *(int *)attr._48_8_ = i;
    *(int *)(attr._48_8_ + 4) = i * local_20;
    pvVar1 = calloc((long)*(int *)(attr._48_8_ + 4),4);
    *(void **)(attr._48_8_ + 0x20) = pvVar1;
    pvVar1 = calloc((long)*(int *)(attr._48_8_ + 4),8);
    *(void **)(attr._48_8_ + 0x18) = pvVar1;
    for (mt._4_4_ = 0; mt._4_4_ < *(int *)(attr._48_8_ + 4); mt._4_4_ = mt._4_4_ + 1) {
      pvVar1 = malloc(0x10000);
      *(void **)(*(long *)(attr._48_8_ + 0x18) + (long)mt._4_4_ * 8) = pvVar1;
    }
    pvVar1 = calloc((long)*(int *)attr._48_8_,8);
    *(void **)(attr._48_8_ + 0x30) = pvVar1;
    pvVar1 = calloc((long)*(int *)attr._48_8_,0x20);
    *(void **)(attr._48_8_ + 0x28) = pvVar1;
    for (mt._4_4_ = 0; mt._4_4_ < *(int *)attr._48_8_; mt._4_4_ = mt._4_4_ + 1) {
      *(int *)(*(long *)(attr._48_8_ + 0x28) + (long)mt._4_4_ * 0x20 + 0x10) = mt._4_4_;
      *(undefined8 *)(*(long *)(attr._48_8_ + 0x28) + (long)mt._4_4_ * 0x20) = attr._48_8_;
      *(int *)(*(long *)(attr._48_8_ + 0x28) + (long)mt._4_4_ * 0x20 + 0x1c) =
           (*(int *)_n_sub_blks_local << 3) >> 0x17;
      pvVar1 = malloc(0x10000);
      *(void **)(*(long *)(attr._48_8_ + 0x28) + (long)mt._4_4_ * 0x20 + 8) = pvVar1;
    }
    pthread_attr_init((pthread_attr_t *)local_68);
    pthread_attr_setdetachstate((pthread_attr_t *)local_68,0);
    pthread_mutex_init((pthread_mutex_t *)(attr._48_8_ + 0x38),(pthread_mutexattr_t *)0x0);
    pthread_cond_init((pthread_cond_t *)(attr._48_8_ + 0x60),(pthread_condattr_t *)0x0);
    for (mt._4_4_ = 1; mt._4_4_ < *(int *)attr._48_8_; mt._4_4_ = mt._4_4_ + 1) {
      pthread_create((pthread_t *)(*(long *)(attr._48_8_ + 0x30) + (long)mt._4_4_ * 8),
                     (pthread_attr_t *)local_68,mt_worker,
                     (void *)(*(long *)(attr._48_8_ + 0x28) + (long)mt._4_4_ * 0x20));
    }
    _n_sub_blks_local->mt = (bgzf_mtaux_t *)attr._48_8_;
    fp_local._4_4_ = 0;
  }
  return fp_local._4_4_;
}

Assistant:

int bgzf_mt(BGZF *fp, int n_threads, int n_sub_blks)
{
    int i;
    mtaux_t *mt;
    pthread_attr_t attr;
    if (!fp->is_write || fp->mt || n_threads <= 1) return -1;
    mt = (mtaux_t*)calloc(1, sizeof(mtaux_t));
    mt->n_threads = n_threads;
    mt->n_blks = n_threads * n_sub_blks;
    mt->len = (int*)calloc(mt->n_blks, sizeof(int));
    mt->blk = (void**)calloc(mt->n_blks, sizeof(void*));
    for (i = 0; i < mt->n_blks; ++i)
        mt->blk[i] = malloc(BGZF_MAX_BLOCK_SIZE);
    mt->tid = (pthread_t*)calloc(mt->n_threads, sizeof(pthread_t)); // tid[0] is not used, as the worker 0 is launched by the master
    mt->w = (worker_t*)calloc(mt->n_threads, sizeof(worker_t));
    for (i = 0; i < mt->n_threads; ++i) {
        mt->w[i].i = i;
        mt->w[i].mt = mt;
        mt->w[i].compress_level = fp->compress_level;
        mt->w[i].buf = malloc(BGZF_MAX_BLOCK_SIZE);
    }
    pthread_attr_init(&attr);
    pthread_attr_setdetachstate(&attr, PTHREAD_CREATE_JOINABLE);
    pthread_mutex_init(&mt->lock, 0);
    pthread_cond_init(&mt->cv, 0);
    for (i = 1; i < mt->n_threads; ++i) // worker 0 is effectively launched by the master thread
        pthread_create(&mt->tid[i], &attr, mt_worker, &mt->w[i]);
    fp->mt = mt;
    return 0;
}